

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_bpf_uninit(ma_bpf *pBPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ulong uVar1;
  long lVar2;
  
  if (pBPF != (ma_bpf *)0x0) {
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < pBPF->bpf2Count; uVar1 = uVar1 + 1) {
      ma_bpf2_uninit((ma_bpf2 *)((long)&(pBPF->pBPF2->bq).format + lVar2),pAllocationCallbacks);
      lVar2 = lVar2 + 0x40;
    }
    if (pBPF->_ownsHeap != 0) {
      ma_free(pBPF->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_bpf_uninit(ma_bpf* pBPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ibpf2;

    if (pBPF == NULL) {
        return;
    }

    for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
        ma_bpf2_uninit(&pBPF->pBPF2[ibpf2], pAllocationCallbacks);
    }

    if (pBPF->_ownsHeap) {
        ma_free(pBPF->_pHeap, pAllocationCallbacks);
    }
}